

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::AddTestPattern
          (ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *this,char *test_case_name
          ,char *test_base_name,TestMetaFactoryBase<gurkenlaeufer::Scenario> *meta_factory)

{
  TestInfo *this_00;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
  local_38;
  TestMetaFactoryBase<gurkenlaeufer::Scenario> *local_28;
  TestMetaFactoryBase<gurkenlaeufer::Scenario> *meta_factory_local;
  char *test_base_name_local;
  char *test_case_name_local;
  ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *this_local;
  
  local_28 = meta_factory;
  meta_factory_local = (TestMetaFactoryBase<gurkenlaeufer::Scenario> *)test_base_name;
  test_base_name_local = test_case_name;
  test_case_name_local = (char *)this;
  this_00 = (TestInfo *)operator_new(0x48);
  TestInfo::TestInfo(this_00,test_base_name_local,(char *)meta_factory_local,local_28);
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
  ::linked_ptr(&local_38,this_00);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>
  ::push_back(&this->tests_,&local_38);
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
  ::~linked_ptr(&local_38);
  return;
}

Assistant:

void AddTestPattern(const char* test_case_name,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory) {
    tests_.push_back(linked_ptr<TestInfo>(new TestInfo(test_case_name,
                                                       test_base_name,
                                                       meta_factory)));
  }